

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined1 local_2d8 [8];
  ShellOptions options;
  undefined1 local_c0 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skipped;
  SExpressionParser parser;
  MixedArena local_70;
  Element *local_40;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> input;
  
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&skipped;
  skipped._M_t._M_impl._0_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(options.WasmShellOption.field_2._M_local_buf + 8),"wasm-shell",
             (allocator<char> *)local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "Execute .wast files",
             (allocator<char> *)
             ((long)&input.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  ShellOptions::ShellOptions
            ((ShellOptions *)local_2d8,(string *)((long)&options.WasmShellOption.field_2 + 8),
             (string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::__cxx11::string::~string((string *)(options.WasmShellOption.field_2._M_local_buf + 8));
  wasm::Options::parse((int)local_2d8,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(options.WasmShellOption.field_2._M_local_buf + 8),"infile",
             (allocator<char> *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,(key_type *)((long)&options.WasmShellOption.field_2 + 8));
  wasm::read_file<std::vector<char,std::allocator<char>>>((string *)local_38,(BinaryOption)pmVar2);
  std::__cxx11::string::~string((string *)(options.WasmShellOption.field_2._M_local_buf + 8));
  if (local_2d8[0] == (Options)0x1) {
    std::operator<<((ostream *)&std::cerr,"parsing text to s-expressions...\n");
  }
  wasm::SExpressionParser::SExpressionParser
            ((SExpressionParser *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (char *)local_38);
  Shell::Shell((Shell *)((long)&options.WasmShellOption.field_2 + 8),(ShellOptions *)local_2d8);
  bVar1 = Shell::parseAndRun((Shell *)((long)&options.WasmShellOption.field_2 + 8),local_40);
  Shell::~Shell((Shell *)((long)&options.WasmShellOption.field_2 + 8));
  MixedArena::~MixedArena(&local_70);
  if (bVar1) {
    Colors::green((ostream *)&std::cerr);
    Colors::bold((ostream *)&std::cerr);
    std::operator<<((ostream *)&std::cerr,"all checks passed.\n");
    Colors::normal((ostream *)&std::cerr);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_38);
  ShellOptions::~ShellOptions((ShellOptions *)local_2d8);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_c0);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::set<size_t> skipped;

  ShellOptions options("wasm-shell", "Execute .wast files");
  options.parse(argc, argv);

  auto input(
    read_file<std::vector<char>>(options.extra["infile"], Flags::Text));

  bool checked = false;
  try {
    if (options.debug) {
      std::cerr << "parsing text to s-expressions...\n";
    }
    SExpressionParser parser(input.data());
    Element& root = *parser.root;
    checked = Shell(options).parseAndRun(root);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    exit(1);
  }

  if (checked) {
    Colors::green(std::cerr);
    Colors::bold(std::cerr);
    std::cerr << "all checks passed.\n";
    Colors::normal(std::cerr);
  }
}